

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O0

int amqp_tune_connection(amqp_connection_state_t state,int channel_max,int frame_max,int heartbeat)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  amqp_connection_state_t in_RDI;
  amqp_connection_state_enum _wanted_state;
  amqp_connection_state_t _check_state;
  int res;
  void *newbuf;
  int seconds;
  amqp_connection_state_t time;
  int local_4;
  
  seconds = 0;
  if (in_RDI->state == CONNECTION_STATE_IDLE) {
    in_RDI->channel_max = in_ESI;
    in_RDI->frame_max = in_EDX;
    in_RDI->heartbeat = in_ECX;
    if (in_RDI->heartbeat < 0) {
      in_RDI->heartbeat = 0;
    }
    time = in_RDI;
    amqp_heartbeat_send(in_RDI);
    local_4 = amqp_time_s_from_now((amqp_time_t *)time,seconds);
    if (local_4 == 0) {
      amqp_heartbeat_recv(in_RDI);
      local_4 = amqp_time_s_from_now((amqp_time_t *)time,seconds);
      if (local_4 == 0) {
        (in_RDI->outbound_buffer).len = (long)in_EDX;
        pvVar1 = realloc((in_RDI->outbound_buffer).bytes,(long)in_EDX);
        if (pvVar1 == (void *)0x0) {
          local_4 = -1;
        }
        else {
          (in_RDI->outbound_buffer).bytes = pvVar1;
          local_4 = 0;
        }
      }
    }
    return local_4;
  }
  amqp_abort("Programming error: invalid AMQP connection state: expected %d, got %d",0,
             (ulong)in_RDI->state);
}

Assistant:

int amqp_tune_connection(amqp_connection_state_t state, int channel_max,
                         int frame_max, int heartbeat) {
  void *newbuf;
  int res;

  ENFORCE_STATE(state, CONNECTION_STATE_IDLE);

  state->channel_max = channel_max;
  state->frame_max = frame_max;

  state->heartbeat = heartbeat;
  if (0 > state->heartbeat) {
    state->heartbeat = 0;
  }

  res = amqp_time_s_from_now(&state->next_send_heartbeat,
                             amqp_heartbeat_send(state));
  if (AMQP_STATUS_OK != res) {
    return res;
  }
  res = amqp_time_s_from_now(&state->next_recv_heartbeat,
                             amqp_heartbeat_recv(state));
  if (AMQP_STATUS_OK != res) {
    return res;
  }

  state->outbound_buffer.len = frame_max;
  newbuf = realloc(state->outbound_buffer.bytes, frame_max);
  if (newbuf == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }
  state->outbound_buffer.bytes = newbuf;

  return AMQP_STATUS_OK;
}